

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TableNextColumn(void)

{
  ImGuiTable *table;
  int column_n;
  bool bVar1;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    bVar1 = false;
  }
  else {
    if ((table->IsInsideRow == true) && (table->CurrentColumn + 1 < table->ColumnsCount)) {
      if (table->CurrentColumn == -1) {
        column_n = 0;
      }
      else {
        TableEndCell(table);
        column_n = table->CurrentColumn + 1;
      }
    }
    else {
      column_n = 0;
      TableNextRow(0,0.0);
    }
    TableBeginCell(table,column_n);
    bVar1 = (table->VisibleUnclippedMaskByIndex >> ((ulong)(uint)table->CurrentColumn & 0x3f) & 1)
            != 0;
  }
  return bVar1;
}

Assistant:

bool    ImGui::TableNextColumn()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;

    if (table->IsInsideRow && table->CurrentColumn + 1 < table->ColumnsCount)
    {
        if (table->CurrentColumn != -1)
            TableEndCell(table);
        TableBeginCell(table, table->CurrentColumn + 1);
    }
    else
    {
        TableNextRow();
        TableBeginCell(table, 0);
    }

    // FIXME-TABLE: it is likely to alter layout if user skips a columns contents based on clipping.
    int column_n = table->CurrentColumn;
    return (table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)) != 0;
}